

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::FromPropertyDescriptor
              (PropertyDescriptor *descriptor,ScriptContext *scriptContext)

{
  code *pcVar1;
  bool bVar2;
  DynamicObject *pDVar3;
  Var pvVar4;
  JavascriptFunction *pJVar5;
  undefined4 *puVar6;
  
  pDVar3 = JavascriptLibrary::CreateObject
                     ((scriptContext->super_ScriptContextBase).javascriptLibrary,false,0);
  if (descriptor->writableSpecified == false && descriptor->valueSpecified == false) {
    if (descriptor->setterSpecified == false && descriptor->getterSpecified == false)
    goto LAB_00ac9af1;
    pJVar5 = (JavascriptFunction *)PropertyDescriptor::GetGetter(descriptor);
    if (scriptContext == (ScriptContext *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x26de,"(scriptContext)","scriptContext");
      if (!bVar2) goto LAB_00ac9b75;
      *puVar6 = 0;
    }
    if ((pJVar5 == (JavascriptFunction *)0x0) ||
       ((((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
        defaultAccessorFunction.ptr == pJVar5)) {
      pJVar5 = (JavascriptFunction *)
               (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    if (pDVar3 != (DynamicObject *)0x0) {
      (*(pDVar3->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x1a])(pDVar3,0x198,pJVar5,0,0);
    }
    pJVar5 = (JavascriptFunction *)PropertyDescriptor::GetSetter(descriptor);
    if (scriptContext == (ScriptContext *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x26de,"(scriptContext)","scriptContext");
      if (!bVar2) {
LAB_00ac9b75:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    if ((pJVar5 == (JavascriptFunction *)0x0) ||
       ((((scriptContext->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
        defaultAccessorFunction.ptr == pJVar5)) {
      pJVar5 = (JavascriptFunction *)
               (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue.ptr;
    }
    if (pDVar3 != (DynamicObject *)0x0) {
      (*(pDVar3->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x1a])(pDVar3,0x19b,pJVar5,0,0);
    }
  }
  else {
    if (pDVar3 != (DynamicObject *)0x0 && descriptor->valueSpecified == true) {
      (*(pDVar3->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x1a])(pDVar3,0x197,(descriptor->Value).ptr,0,0);
    }
    if (descriptor->writableSpecified == true) {
      bVar2 = PropertyDescriptor::IsWritable(descriptor);
      pvVar4 = JavascriptBoolean::ToVar((uint)bVar2,scriptContext);
      if (pDVar3 != (DynamicObject *)0x0) {
        (*(pDVar3->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject[0x1a])(pDVar3,0x196,pvVar4,0,0);
      }
    }
  }
LAB_00ac9af1:
  if (descriptor->enumerableSpecified == true) {
    bVar2 = PropertyDescriptor::IsEnumerable(descriptor);
    pvVar4 = JavascriptBoolean::ToVar((uint)bVar2,scriptContext);
    if (pDVar3 != (DynamicObject *)0x0) {
      (*(pDVar3->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x1a])(pDVar3,0x194,pvVar4,0,0);
    }
  }
  if (descriptor->configurableSpecified == true) {
    bVar2 = PropertyDescriptor::IsConfigurable(descriptor);
    pvVar4 = JavascriptBoolean::ToVar((uint)bVar2,scriptContext);
    if (pDVar3 != (DynamicObject *)0x0) {
      (*(pDVar3->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
        _vptr_IRecyclerVisitedObject[0x1a])(pDVar3,0x195,pvVar4,0,0);
    }
  }
  return pDVar3;
}

Assistant:

Var JavascriptOperators::FromPropertyDescriptor(const PropertyDescriptor& descriptor, ScriptContext* scriptContext)
    {
        DynamicObject* object = scriptContext->GetLibrary()->CreateObject();

        // ES5 Section 8.10.4 specifies the order for adding these properties.
        if (descriptor.IsDataDescriptor())
        {
            if (descriptor.ValueSpecified())
            {
                JavascriptOperators::InitProperty(object, PropertyIds::value, descriptor.GetValue());
            }
            if (descriptor.WritableSpecified())
            {
                JavascriptOperators::InitProperty(object, PropertyIds::writable, JavascriptBoolean::ToVar(descriptor.IsWritable(), scriptContext));
            }
        }
        else if (descriptor.IsAccessorDescriptor())
        {
            JavascriptOperators::InitProperty(object, PropertyIds::get, JavascriptOperators::CanonicalizeAccessor(descriptor.GetGetter(), scriptContext));
            JavascriptOperators::InitProperty(object, PropertyIds::set, JavascriptOperators::CanonicalizeAccessor(descriptor.GetSetter(), scriptContext));
        }

        if (descriptor.EnumerableSpecified())
        {
            JavascriptOperators::InitProperty(object, PropertyIds::enumerable, JavascriptBoolean::ToVar(descriptor.IsEnumerable(), scriptContext));
        }
        if (descriptor.ConfigurableSpecified())
        {
            JavascriptOperators::InitProperty(object, PropertyIds::configurable, JavascriptBoolean::ToVar(descriptor.IsConfigurable(), scriptContext));
        }
        return object;
    }